

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpnetworkconnection.cpp
# Opt level: O2

void __thiscall
QHttpNetworkConnectionPrivate::fillPipeline(QHttpNetworkConnectionPrivate *this,QIODevice *socket)

{
  qsizetype qVar1;
  ulong uVar2;
  bool bVar3;
  int iVar4;
  Operation OVar5;
  SocketState SVar6;
  QHttpNetworkConnectionChannel *pQVar7;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> QStack_58;
  QArrayDataPointer<char16_t> local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (((this->highPriorityQueue).d.size == 0) && ((this->lowPriorityQueue).d.size == 0))
  goto LAB_001ec76a;
  iVar4 = indexOf(this,socket);
  pQVar7 = this->channels;
  if (((pQVar7[iVar4].reply == (QHttpNetworkReply *)0x0) ||
      ((((1 < (ulong)pQVar7[iVar4].alreadyPipelinedRequests.d.size ||
         (pQVar7[iVar4].pipeliningSupported != PipeliningProbablySupported)) ||
        (bVar3 = QHttpNetworkRequest::isPipeliningAllowed(&pQVar7[iVar4].request), !bVar3)) ||
       ((OVar5 = QHttpNetworkRequest::operation(&this->channels[iVar4].request), OVar5 != Get ||
        (SVar6 = QSocketAbstraction::socketState(socket), SVar6 != ConnectedState)))))) ||
     (this->channels[iVar4].resendCurrent != false)) goto LAB_001ec76a;
  bVar3 = QAuthenticator::isNull(&this->channels[iVar4].authenticator);
  if (bVar3) {
LAB_001ec612:
    bVar3 = QAuthenticator::isNull(&this->channels[iVar4].proxyAuthenticator);
    if (!bVar3) {
      QAuthenticator::user((QString *)&local_40,&this->channels[iVar4].proxyAuthenticator);
      if (local_40.size != 0) goto LAB_001ec760;
      QAuthenticator::password((QString *)&QStack_58,&this->channels[iVar4].proxyAuthenticator);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&QStack_58);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_40);
      if (QStack_58.size != 0) goto LAB_001ec76a;
    }
    pQVar7 = this->channels;
    if ((pQVar7[iVar4].state == ReadingState) || (pQVar7[iVar4].state == WaitingState)) {
      do {
        if ((this->highPriorityQueue).d.size == 0) break;
        qVar1 = pQVar7[iVar4].alreadyPipelinedRequests.d.size;
        fillPipeline(this,&this->highPriorityQueue,pQVar7 + iVar4);
        pQVar7 = this->channels;
        uVar2 = pQVar7[iVar4].alreadyPipelinedRequests.d.size;
        if (2 < uVar2) goto LAB_001ec6d0;
      } while ((long)(int)qVar1 != uVar2);
      while ((this->lowPriorityQueue).d.size != 0) {
        qVar1 = pQVar7[iVar4].alreadyPipelinedRequests.d.size;
        fillPipeline(this,&this->lowPriorityQueue,pQVar7 + iVar4);
        pQVar7 = this->channels;
        uVar2 = pQVar7[iVar4].alreadyPipelinedRequests.d.size;
        if ((2 < uVar2) || ((long)(int)qVar1 == uVar2)) break;
      }
LAB_001ec6d0:
      QHttpNetworkConnectionChannel::pipelineFlush
                ((QHttpNetworkConnectionChannel *)(pQVar7 + iVar4));
    }
  }
  else {
    QAuthenticator::user((QString *)&local_40,&this->channels[iVar4].authenticator);
    if (local_40.size == 0) {
      QAuthenticator::password((QString *)&QStack_58,&this->channels[iVar4].authenticator);
      qVar1 = QStack_58.size;
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&QStack_58);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_40);
      if (qVar1 != 0) goto LAB_001ec76a;
      goto LAB_001ec612;
    }
LAB_001ec760:
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_40);
  }
LAB_001ec76a:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QHttpNetworkConnectionPrivate::fillPipeline(QIODevice *socket)
{
    // return fast if there is nothing to pipeline
    if (highPriorityQueue.isEmpty() && lowPriorityQueue.isEmpty())
        return;

    int i = indexOf(socket);

    // return fast if there was no reply right now processed
    if (channels[i].reply == nullptr)
        return;

    if (! (defaultPipelineLength - channels[i].alreadyPipelinedRequests.size() >= defaultRePipelineLength)) {
        return;
    }

    if (channels[i].pipeliningSupported != QHttpNetworkConnectionChannel::PipeliningProbablySupported)
        return;

    // the current request that is in must already support pipelining
    if (!channels[i].request.isPipeliningAllowed())
        return;

    // the current request must be a idempotent (right now we only check GET)
    if (channels[i].request.operation() != QHttpNetworkRequest::Get)
        return;

    // check if socket is connected
    if (QSocketAbstraction::socketState(socket) != QAbstractSocket::ConnectedState)
        return;

    // check for resendCurrent
    if (channels[i].resendCurrent)
        return;

    // we do not like authentication stuff
    // ### make sure to be OK with this in later releases
    if (!channels[i].authenticator.isNull()
        && (!channels[i].authenticator.user().isEmpty()
            || !channels[i].authenticator.password().isEmpty()))
        return;
    if (!channels[i].proxyAuthenticator.isNull()
        && (!channels[i].proxyAuthenticator.user().isEmpty()
            || !channels[i].proxyAuthenticator.password().isEmpty()))
        return;

    // must be in ReadingState or WaitingState
    if (! (channels[i].state == QHttpNetworkConnectionChannel::WaitingState
           || channels[i].state == QHttpNetworkConnectionChannel::ReadingState))
        return;

    int lengthBefore;
    while (!highPriorityQueue.isEmpty()) {
        lengthBefore = channels[i].alreadyPipelinedRequests.size();
        fillPipeline(highPriorityQueue, channels[i]);

        if (channels[i].alreadyPipelinedRequests.size() >= defaultPipelineLength) {
            channels[i].pipelineFlush();
            return;
        }

        if (lengthBefore == channels[i].alreadyPipelinedRequests.size())
            break; // did not process anything, now do the low prio queue
    }

    while (!lowPriorityQueue.isEmpty()) {
        lengthBefore = channels[i].alreadyPipelinedRequests.size();
        fillPipeline(lowPriorityQueue, channels[i]);

        if (channels[i].alreadyPipelinedRequests.size() >= defaultPipelineLength) {
            channels[i].pipelineFlush();
            return;
        }

        if (lengthBefore == channels[i].alreadyPipelinedRequests.size())
            break; // did not process anything
    }


    channels[i].pipelineFlush();
}